

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::PriceSyncVisitor::HandlePriceUpdateEvent
          (PriceSyncVisitor *this,uint32_t sid,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *price,SubjectSetRegister *subjectSetRegister,bool replaceAllFields)

{
  bool bVar1;
  reference to_copy;
  Subject subject;
  Subject local_40;
  
  to_copy = std::
            vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            ::at(this->subject_set_,(ulong)sid);
  price::subject::Subject::Subject(&local_40,to_copy);
  bVar1 = SubjectSetRegister::IsCurrentlySubscribed(subjectSetRegister,&local_40);
  if (bVar1) {
    provider::AbstractProvider::PublishPriceUpdate
              (&this->pixie_provider->super_AbstractProvider,&local_40,price,replaceAllFields);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40.components_);
  return;
}

Assistant:

void PixieProvider::PriceSyncVisitor::HandlePriceUpdateEvent(uint32_t sid, std::map<std::string, PriceField>& price, SubjectSetRegister& subjectSetRegister,
                                                             bool replaceAllFields)
{
    Subject subject = subject_set_.at(sid);
    if (subjectSetRegister.IsCurrentlySubscribed(subject))
    {
        pixie_provider.PublishPriceUpdate(subject, price, replaceAllFields);
    }
}